

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

int __thiscall Polynomial::evaluate(Polynomial *this,int *pt)

{
  pointer poVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  pointer piVar6;
  long lVar7;
  uint uVar8;
  
  if (0 < this->mNumStates) {
    piVar6 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      piVar6[lVar5] = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->mNumStates);
  }
  if (0 < this->mNumVariables) {
    piVar6 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      piVar6[this->mNumStates + lVar5] = pt[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->mNumVariables);
  }
  lVar5 = (long)this->mResultLocation;
  if (this->mResultLocation < this->mFirstOperation) {
    piVar6 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    piVar6 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar1 = (this->mOperands).
             super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)this->mFirstOperation;
    do {
      lVar5 = lVar7 - this->mFirstOperation;
      switch(poVar1[lVar5].op) {
      case PLUS:
        piVar2 = poVar1[lVar5].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar6[piVar2[1]] + piVar6[*piVar2];
        goto LAB_00107685;
      case TIMES:
        piVar2 = poVar1[lVar5].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar6[piVar2[1]] * piVar6[*piVar2];
LAB_00107685:
        iVar4 = iVar4 % this->mNumStates;
        break;
      case POWER:
        piVar2 = poVar1[lVar5].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar2[1];
        if (iVar4 < 1) {
          iVar4 = 1;
        }
        else {
          uVar8 = iVar4 + 1;
          lVar5 = 1;
          do {
            lVar5 = ((long)(int)lVar5 * (long)piVar6[*piVar2]) % (long)this->mNumStates;
            iVar4 = (int)lVar5;
            uVar8 = uVar8 - 1;
          } while (1 < uVar8);
        }
        break;
      case NOT:
        iVar4 = ~piVar6[*poVar1[lVar5].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start] + this->mNumStates;
        break;
      case MAX:
        piVar2 = poVar1[lVar5].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar6[piVar2[1]];
        if (piVar6[piVar2[1]] < piVar6[*piVar2]) {
          iVar4 = piVar6[*piVar2];
        }
        break;
      case MIN:
        piVar2 = poVar1[lVar5].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar6[*piVar2];
        if (piVar6[piVar2[1]] < piVar6[*piVar2]) {
          iVar4 = piVar6[piVar2[1]];
        }
        break;
      default:
        goto switchD_001075fd_default;
      }
      piVar6[lVar7] = iVar4;
switchD_001075fd_default:
      lVar5 = (long)this->mResultLocation;
      bVar3 = lVar7 < lVar5;
      lVar7 = lVar7 + 1;
    } while (bVar3);
  }
  return piVar6[lVar5];
}

Assistant:

int Polynomial::evaluate(const int pt[]) {
  // ASSUME: pt is a pointer to an array 0..numvars-1 of values in the range 0..numConstants-1
  // evaluate at a point
  // 1. fill in the n variables values in the array 'mEvaluationValues'.
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues[i] = i;
  for (int i=0; i<mNumVariables; i++)
    mEvaluationValues[i + mNumStates] = pt[i];
  for (int i = mFirstOperation; i <= mResultLocation; i++)
    {
      operand& a = mOperands[i-mFirstOperation];
      switch (a.op) {
      case operandType::PLUS:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                + mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::TIMES:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                * mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::POWER:
        mEvaluationValues[i] = exp(mEvaluationValues[a.args[0]], a.args[1]);
        break;
      case operandType::MAX:
        mEvaluationValues[i] = std::max(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::MIN:
        mEvaluationValues[i] = std::min(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::NOT:
        mEvaluationValues[i] = mNumStates - 1 - mEvaluationValues[a.args[0]];
        break;
      }
    }
  return mEvaluationValues[mResultLocation];
}